

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall cfd::core::TaprootScriptTree::AddBranch(TaprootScriptTree *this,TapBranch *branch)

{
  ByteData256 local_30;
  TapBranch *local_18;
  TapBranch *branch_local;
  TaprootScriptTree *this_local;
  
  local_18 = branch;
  branch_local = &this->super_TapBranch;
  TapBranch::AddBranch(&this->super_TapBranch,branch);
  TapBranch::GetCurrentBranchHash(&local_30,local_18);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
  emplace_back<cfd::core::ByteData256>(&this->nodes_,&local_30);
  ByteData256::~ByteData256(&local_30);
  return;
}

Assistant:

void TaprootScriptTree::AddBranch(const TapBranch& branch) {
  TapBranch::AddBranch(branch);
  nodes_.emplace_back(branch.GetCurrentBranchHash());
}